

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O1

void quicly_sendstate_init(quicly_sendstate_t *state)

{
  quicly_ranges_init_with_range(&state->acked,0,0);
  (state->pending).ranges = &(state->pending)._initial;
  (state->pending).num_ranges = 0;
  (state->pending).capacity = 1;
  state->size_inflight = 0;
  state->final_size = 0xffffffffffffffff;
  return;
}

Assistant:

void quicly_sendstate_init(quicly_sendstate_t *state)
{
    quicly_ranges_init_with_range(&state->acked, 0, 0);
    quicly_ranges_init(&state->pending);
    state->size_inflight = 0;
    state->final_size = UINT64_MAX;
}